

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcondvariable-posix.c
# Opt level: O2

pboolean p_cond_variable_broadcast(PCondVariable *cond)

{
  int iVar1;
  pboolean pVar2;
  
  if (cond == (PCondVariable *)0x0) {
    pVar2 = 0;
  }
  else {
    iVar1 = pthread_cond_broadcast((pthread_cond_t *)cond);
    if (iVar1 == 0) {
      pVar2 = 1;
    }
    else {
      pVar2 = 0;
      printf("** Error: %s **\n",
             "PCondVariable::p_cond_variable_broadcast: thread_cond_broadcast() failed");
    }
  }
  return pVar2;
}

Assistant:

P_LIB_API pboolean
p_cond_variable_broadcast (PCondVariable *cond)
{
	if (P_UNLIKELY (cond == NULL))
		return FALSE;

	if (P_UNLIKELY (pthread_cond_broadcast (&cond->hdl) != 0)) {
		P_ERROR ("PCondVariable::p_cond_variable_broadcast: thread_cond_broadcast() failed");
		return FALSE;
	}

	return TRUE;
}